

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  int iVar1;
  ImDrawChannel *pIVar2;
  undefined8 *puVar3;
  int in_EDX;
  ImDrawChannel *in_RDI;
  ImDrawCmd draw_cmd;
  int i;
  int old_channels_count;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  ImDrawCmd *in_stack_ffffffffffffff80;
  int local_1c;
  
  if (((in_RDI->_CmdBuffer).Size != 0) || (1 < (in_RDI->_CmdBuffer).Capacity)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x5a4,"Split","ImGui ASSERT FAILED: %s",
                "_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
               );
  }
  iVar1 = *(int *)&(in_RDI->_CmdBuffer).Data;
  if (iVar1 < in_EDX) {
    ImVector<ImDrawChannel>::resize
              ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  (in_RDI->_CmdBuffer).Capacity = in_EDX;
  pIVar2 = ImVector<ImDrawChannel>::operator[]
                     ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                     );
  memset(pIVar2,0,0x20);
  for (local_1c = 1; local_1c < in_EDX; local_1c = local_1c + 1) {
    if (local_1c < iVar1) {
      ImVector<ImDrawChannel>::operator[]
                ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      ImVector<ImDrawCmd>::resize
                ((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      ImVector<ImDrawChannel>::operator[]
                ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      ImVector<unsigned_short>::resize
                ((ImVector<unsigned_short> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    }
    else {
      in_stack_ffffffffffffff80 =
           (ImDrawCmd *)
           ImVector<ImDrawChannel>::operator[]
                     ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                     );
      puVar3 = (undefined8 *)operator_new(0x20);
      puVar3[2] = 0;
      puVar3[3] = 0;
      *puVar3 = 0;
      puVar3[1] = 0;
      ImDrawChannel::ImDrawChannel(in_RDI);
    }
    pIVar2 = ImVector<ImDrawChannel>::operator[]
                       ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,
                        in_stack_ffffffffffffff7c);
    if ((pIVar2->_CmdBuffer).Size == 0) {
      ImDrawCmd::ImDrawCmd(in_stack_ffffffffffffff80);
      ImVector<ImDrawChannel>::operator[]
                ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      ImVector<ImDrawCmd>::push_back
                ((ImVector<ImDrawCmd> *)in_stack_ffffffffffffff80,
                 (ImDrawCmd *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            ImDrawCmd_HeaderCopy(&draw_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}